

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfoMB * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float fVar2;
  undefined8 uVar3;
  BBox1f BVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  long lVar7;
  long lVar8;
  PrimRefMB *pPVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar14;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  uint uVar38;
  BBox1f *pBVar40;
  uint uVar41;
  ulong uVar42;
  uint uVar43;
  undefined4 uVar44;
  long lVar45;
  int iVar46;
  long lVar47;
  int iVar48;
  long lVar49;
  size_t itime;
  ulong uVar50;
  float fVar51;
  float fVar63;
  float fVar64;
  Vec3fa n1;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar74;
  float fVar75;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar76;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  float fVar77;
  float fVar86;
  float fVar87;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  float fVar96;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar97;
  float fVar106;
  float fVar107;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar108;
  undefined1 auVar105 [32];
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar120;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar118;
  float fVar119;
  undefined1 auVar117 [64];
  undefined1 auVar121 [16];
  float fVar127;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar125;
  float fVar126;
  undefined1 auVar124 [64];
  float fVar128;
  float fVar133;
  float fVar134;
  float fVar135;
  vfloat4 b0;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  float fVar136;
  float fVar140;
  float fVar141;
  vfloat4 a0_1;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  float fVar143;
  undefined1 auVar139 [64];
  float fVar144;
  float fVar145;
  float fVar149;
  float fVar151;
  undefined1 auVar146 [16];
  float fVar153;
  undefined1 auVar147 [32];
  float fVar150;
  float fVar152;
  undefined1 auVar148 [32];
  Vec3fa n0;
  float fVar156;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar157 [32];
  float fVar158;
  float fVar160;
  float fVar161;
  undefined1 auVar159 [16];
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar166;
  undefined1 auVar164 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar169;
  float fVar173;
  float fVar174;
  vfloat4 a0;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  ulong local_330;
  unsigned_long local_300;
  size_t local_2f8;
  size_t local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float fStack_2c0;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  anon_class_16_2_07cfa4d6 local_210;
  ulong local_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  float fStack_1e0;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  undefined4 uStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar39;
  
  fStack_24c = INFINITY;
  local_258._0_4_ = INFINITY;
  local_258._4_4_ = INFINITY;
  fStack_250 = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[3] = INFINITY;
  fStack_29c = -INFINITY;
  local_2a8._0_4_ = -INFINITY;
  local_2a8._4_4_ = -INFINITY;
  fStack_2a0 = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar52._8_4_ = 0x3f800000;
  auVar52._0_8_ = &DAT_3f8000003f800000;
  auVar52._12_4_ = 0x3f800000;
  uVar3 = vmovlps_avx(auVar52);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar3;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar50 = r->_begin;
  local_2f8 = __return_storage_ptr__->num_time_segments;
  local_330 = __return_storage_ptr__->max_num_time_segments;
  local_278._0_8_ = __return_storage_ptr__->max_time_range;
  local_278._8_8_ = __return_storage_ptr__->time_range;
  auVar53._0_4_ = (__return_storage_ptr__->max_time_range).lower;
  auVar53._4_4_ = (__return_storage_ptr__->max_time_range).upper;
  auVar53._8_4_ = (__return_storage_ptr__->time_range).lower;
  auVar53._12_4_ = (__return_storage_ptr__->time_range).upper;
  local_2b8._0_4_ = local_258._0_4_;
  local_2b8._4_4_ = local_258._4_4_;
  fStack_2b0 = fStack_250;
  fStack_2ac = fStack_24c;
  local_298._0_4_ = local_258._0_4_;
  local_298._4_4_ = local_258._4_4_;
  fStack_290 = fStack_250;
  fStack_28c = fStack_24c;
  local_288._0_4_ = local_2a8._0_4_;
  local_288._4_4_ = local_2a8._4_4_;
  fStack_280 = fStack_2a0;
  fStack_27c = fStack_29c;
  local_268._0_4_ = local_2a8._0_4_;
  local_268._4_4_ = local_2a8._4_4_;
  fStack_260 = fStack_2a0;
  fStack_25c = fStack_29c;
  if (uVar50 < r->_end) {
    local_300 = (__return_storage_ptr__->object_range)._end;
    auVar139 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar117 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    auVar124 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    fStack_2b0 = INFINITY;
    local_2b8 = (undefined1  [8])0x7f8000007f800000;
    fStack_2ac = INFINITY;
    fStack_2a0 = -INFINITY;
    local_2a8 = (undefined1  [8])0xff800000ff800000;
    fStack_29c = -INFINITY;
    fStack_250 = INFINITY;
    local_258 = (undefined1  [8])0x7f8000007f800000;
    fStack_24c = INFINITY;
    fStack_290 = INFINITY;
    local_298 = (undefined1  [8])0x7f8000007f800000;
    fStack_28c = INFINITY;
    fStack_260 = -INFINITY;
    local_268 = (undefined1  [8])0xff800000ff800000;
    fStack_25c = -INFINITY;
    fStack_280 = -INFINITY;
    local_288 = (undefined1  [8])0xff800000ff800000;
    fStack_27c = -INFINITY;
    local_2e0 = k;
    local_278 = auVar53;
    do {
      BVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      auVar102._8_8_ = 0;
      auVar102._0_4_ = BVar4.lower;
      auVar102._4_4_ = BVar4.upper;
      fVar88 = BVar4.lower;
      auVar53 = vmovshdup_avx(auVar102);
      fVar134 = auVar53._0_4_ - fVar88;
      uVar38 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar50);
      uVar39 = (ulong)(uVar38 + 3);
      pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar39 < (pBVar5->super_RawBufferView).num) {
        fVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.fnumTimeSegments;
        auVar53 = ZEXT416((uint)(fVar2 * ((t0t1->lower - fVar88) / fVar134) * 1.0000002));
        auVar53 = vroundss_avx(auVar53,auVar53,9);
        auVar53 = vmaxss_avx(auVar139._0_16_,auVar53);
        uVar41 = (uint)auVar53._0_4_;
        auVar53 = ZEXT416((uint)(fVar2 * ((t0t1->upper - fVar88) / fVar134) * 0.99999976));
        auVar53 = vroundss_avx(auVar53,auVar53,10);
        auVar53 = vminss_avx(auVar53,ZEXT416((uint)fVar2));
        uVar43 = (uint)auVar53._0_4_;
        bVar10 = uVar43 < uVar41;
        pBVar40 = t0t1;
        if (uVar41 <= uVar43) {
          uVar42 = (ulong)(int)uVar41;
          pBVar40 = (BBox1f *)(ulong)(uVar38 + 2);
          pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.normals.items;
          fVar134 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                    super_CurveGeometry.maxRadiusScale;
          _fStack_1d0 = bezier_basis0._1640_8_;
          local_1d8 = (undefined1  [8])bezier_basis0._1632_8_;
          auVar53 = _local_1d8;
          _fStack_1c8 = bezier_basis0._1648_8_;
          uVar22 = _fStack_1c8;
          _fStack_1c0 = bezier_basis0._1656_8_;
          uVar23 = _fStack_1c0;
          local_1f8 = (float)bezier_basis0._2788_8_;
          fStack_1f4 = SUB84(bezier_basis0._2788_8_,4);
          fStack_1f0 = (float)bezier_basis0._2796_8_;
          fStack_1ec = SUB84(bezier_basis0._2796_8_,4);
          _fStack_1e8 = bezier_basis0._2804_8_;
          uVar3 = _fStack_1e8;
          _fStack_1e0 = bezier_basis0._2812_8_;
          uVar21 = _fStack_1e0;
          local_178 = (float)bezier_basis0._3944_8_;
          fStack_174 = SUB84(bezier_basis0._3944_8_,4);
          fStack_170 = (float)bezier_basis0._3952_8_;
          fStack_16c = SUB84(bezier_basis0._3952_8_,4);
          _fStack_168 = bezier_basis0._3960_8_;
          uVar32 = _fStack_168;
          _fStack_160 = bezier_basis0._3968_8_;
          uVar33 = _fStack_160;
          _local_1b8 = bezier_basis0._5100_8_;
          uVar24 = _local_1b8;
          _fStack_1b0 = bezier_basis0._5108_8_;
          uVar25 = _fStack_1b0;
          _fStack_1a8 = bezier_basis0._5116_8_;
          uVar26 = _fStack_1a8;
          _fStack_1a0 = bezier_basis0._5124_8_;
          uVar27 = _fStack_1a0;
          _local_198 = bezier_basis0._6256_8_;
          uVar28 = _local_198;
          _fStack_190 = bezier_basis0._6264_8_;
          uVar29 = _fStack_190;
          _fStack_188 = bezier_basis0._6272_8_;
          uVar30 = _fStack_188;
          _fStack_180 = bezier_basis0._6280_8_;
          uVar31 = _fStack_180;
          local_b8 = (float)bezier_basis0._7412_8_;
          fStack_b4 = SUB84(bezier_basis0._7412_8_,4);
          fStack_b0 = (float)bezier_basis0._7420_8_;
          fStack_ac = SUB84(bezier_basis0._7420_8_,4);
          fStack_a8 = (float)bezier_basis0._7428_8_;
          fStack_a4 = SUB84(bezier_basis0._7428_8_,4);
          fStack_a0 = (float)bezier_basis0._7436_8_;
          uStack_9c = SUB84(bezier_basis0._7436_8_,4);
          _local_d8 = bezier_basis0._8568_8_;
          uVar34 = _local_d8;
          _fStack_d0 = bezier_basis0._8576_8_;
          uVar35 = _fStack_d0;
          _fStack_c8 = bezier_basis0._8584_8_;
          uVar36 = _fStack_c8;
          _fStack_c0 = bezier_basis0._8592_8_;
          uVar37 = _fStack_c0;
          lVar49 = uVar42 * 0x38 + 0x10;
          do {
            lVar7 = *(long *)((long)pBVar5 + lVar49 + -0x10);
            lVar8 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar49);
            lVar45 = lVar8 * (ulong)uVar38;
            lVar47 = lVar8 * (ulong)(uVar38 + 1);
            auVar52 = vinsertps_avx(ZEXT416(*(uint *)(lVar7 + 0xc + lVar45)),
                                    ZEXT416(*(uint *)(lVar7 + 0xc + lVar47)),0x10);
            auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * (long)pBVar40)),
                                    0x20);
            auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * uVar39)),0x30);
            auVar65._8_4_ = 0x7fffffff;
            auVar65._0_8_ = 0x7fffffff7fffffff;
            auVar65._12_4_ = 0x7fffffff;
            auVar52 = vandps_avx(auVar52,auVar65);
            auVar102 = auVar117._0_16_;
            auVar52 = vcmpps_avx(auVar52,auVar102,5);
            _fStack_1e8 = bezier_basis0._2804_8_;
            _fStack_1e0 = bezier_basis0._2812_8_;
            _local_1d8 = auVar53;
            _fStack_1c8 = bezier_basis0._1648_8_;
            _fStack_1c0 = bezier_basis0._1656_8_;
            _local_1b8 = bezier_basis0._5100_8_;
            _fStack_1b0 = bezier_basis0._5108_8_;
            _fStack_1a8 = bezier_basis0._5116_8_;
            _fStack_1a0 = bezier_basis0._5124_8_;
            _local_198 = bezier_basis0._6256_8_;
            _fStack_190 = bezier_basis0._6264_8_;
            _fStack_188 = bezier_basis0._6272_8_;
            _fStack_180 = bezier_basis0._6280_8_;
            _fStack_168 = bezier_basis0._3960_8_;
            _fStack_160 = bezier_basis0._3968_8_;
            _local_d8 = bezier_basis0._8568_8_;
            _fStack_d0 = bezier_basis0._8576_8_;
            _fStack_c8 = bezier_basis0._8584_8_;
            _fStack_c0 = bezier_basis0._8592_8_;
            if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar52[0xf] < '\0') break;
            auVar52 = *(undefined1 (*) [16])(lVar7 + lVar45);
            auVar55 = auVar124._0_16_;
            auVar65 = vcmpps_avx(auVar52,auVar55,6);
            auVar54 = vcmpps_avx(auVar52,auVar102,1);
            auVar65 = vandps_avx(auVar65,auVar54);
            uVar44 = vmovmskps_avx(auVar65);
            _fStack_1e8 = uVar3;
            _fStack_1e0 = uVar21;
            _fStack_1c8 = uVar22;
            _fStack_1c0 = uVar23;
            _local_1b8 = uVar24;
            _fStack_1b0 = uVar25;
            _fStack_1a8 = uVar26;
            _fStack_1a0 = uVar27;
            _local_198 = uVar28;
            _fStack_190 = uVar29;
            _fStack_188 = uVar30;
            _fStack_180 = uVar31;
            _fStack_168 = uVar32;
            _fStack_160 = uVar33;
            _local_d8 = uVar34;
            _fStack_d0 = uVar35;
            _fStack_c8 = uVar36;
            _fStack_c0 = uVar37;
            if ((~(byte)uVar44 & 7) != 0) break;
            auVar65 = *(undefined1 (*) [16])(lVar7 + lVar47);
            auVar54 = vcmpps_avx(auVar65,auVar55,6);
            auVar56 = vcmpps_avx(auVar65,auVar102,1);
            auVar54 = vandps_avx(auVar54,auVar56);
            uVar44 = vmovmskps_avx(auVar54);
            if ((~(byte)uVar44 & 7) != 0) break;
            auVar54 = *(undefined1 (*) [16])(lVar7 + lVar8 * (long)pBVar40);
            auVar56 = vcmpps_avx(auVar54,auVar55,6);
            auVar57 = vcmpps_avx(auVar54,auVar102,1);
            auVar56 = vandps_avx(auVar56,auVar57);
            uVar44 = vmovmskps_avx(auVar56);
            if ((~(byte)uVar44 & 7) != 0) break;
            auVar56 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar39);
            auVar57 = vcmpps_avx(auVar56,auVar55,6);
            auVar58 = vcmpps_avx(auVar56,auVar102,1);
            auVar57 = vandps_avx(auVar57,auVar58);
            uVar44 = vmovmskps_avx(auVar57);
            if ((~(byte)uVar44 & 7) != 0) break;
            lVar7 = *(long *)((long)pBVar6 + lVar49 + -0x10);
            lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar49);
            auVar57 = *(undefined1 (*) [16])(lVar7 + lVar8 * (ulong)uVar38);
            auVar58 = vcmpps_avx(auVar57,auVar55,6);
            auVar66 = vcmpps_avx(auVar57,auVar102,1);
            auVar58 = vandps_avx(auVar58,auVar66);
            uVar44 = vmovmskps_avx(auVar58);
            if ((~(byte)uVar44 & 7) != 0) break;
            auVar58 = *(undefined1 (*) [16])(lVar7 + lVar8 * (ulong)(uVar38 + 1));
            auVar55 = vcmpps_avx(auVar58,auVar55,6);
            auVar102 = vcmpps_avx(auVar58,auVar102,1);
            auVar102 = vandps_avx(auVar55,auVar102);
            uVar44 = vmovmskps_avx(auVar102);
            if ((~(byte)uVar44 & 7) != 0) break;
            auVar102 = vshufps_avx(auVar52,auVar52,0xff);
            auVar52 = vinsertps_avx(auVar52,ZEXT416((uint)(auVar102._0_4_ * fVar134)),0x30);
            auVar102 = vshufps_avx(auVar65,auVar65,0xff);
            auVar102 = vinsertps_avx(auVar65,ZEXT416((uint)(auVar102._0_4_ * fVar134)),0x30);
            auVar65 = vshufps_avx(auVar54,auVar54,0xff);
            auVar65 = vinsertps_avx(auVar54,ZEXT416((uint)(auVar65._0_4_ * fVar134)),0x30);
            auVar54 = vshufps_avx(auVar56,auVar56,0xff);
            auVar54 = vinsertps_avx(auVar56,ZEXT416((uint)(auVar54._0_4_ * fVar134)),0x30);
            pfVar1 = (float *)(lVar7 + lVar8 * (long)pBVar40);
            fVar144 = *pfVar1;
            fVar149 = pfVar1[1];
            fVar151 = pfVar1[2];
            fVar153 = pfVar1[3];
            pfVar1 = (float *)(lVar7 + lVar8 * uVar39);
            fVar96 = *pfVar1;
            fVar77 = pfVar1[1];
            fVar86 = pfVar1[2];
            fVar87 = pfVar1[3];
            fVar97 = auVar54._0_4_;
            fVar106 = auVar54._4_4_;
            fVar107 = auVar54._8_4_;
            fVar108 = auVar54._12_4_;
            fVar109 = auVar65._0_4_;
            fVar118 = auVar65._4_4_;
            fVar119 = auVar65._8_4_;
            fVar120 = auVar65._12_4_;
            fVar88 = auVar102._0_4_;
            fVar74 = auVar102._4_4_;
            fVar75 = auVar102._8_4_;
            fVar76 = auVar102._12_4_;
            auVar137._0_4_ = fVar88 * 0.0 + fVar109 * 0.5 + fVar97 * 0.0;
            auVar137._4_4_ = fVar74 * 0.0 + fVar118 * 0.5 + fVar106 * 0.0;
            auVar137._8_4_ = fVar75 * 0.0 + fVar119 * 0.5 + fVar107 * 0.0;
            auVar137._12_4_ = fVar76 * 0.0 + fVar120 * 0.5 + fVar108 * 0.0;
            fVar128 = auVar52._0_4_;
            auVar159._0_4_ = fVar128 * 0.5;
            fVar133 = auVar52._4_4_;
            auVar159._4_4_ = fVar133 * 0.5;
            fVar135 = auVar52._8_4_;
            auVar159._8_4_ = fVar135 * 0.5;
            fVar136 = auVar52._12_4_;
            auVar159._12_4_ = fVar136 * 0.5;
            auVar70 = vsubps_avx(auVar137,auVar159);
            fVar51 = auVar58._0_4_;
            fVar63 = auVar58._4_4_;
            fVar64 = auVar58._8_4_;
            fVar156 = auVar58._12_4_;
            auVar138._0_4_ = fVar51 * 0.0 + fVar144 * 0.5 + fVar96 * 0.0;
            auVar138._4_4_ = fVar63 * 0.0 + fVar149 * 0.5 + fVar77 * 0.0;
            auVar138._8_4_ = fVar64 * 0.0 + fVar151 * 0.5 + fVar86 * 0.0;
            auVar138._12_4_ = fVar156 * 0.0 + fVar153 * 0.5 + fVar87 * 0.0;
            fVar143 = auVar57._0_4_;
            auVar170._0_4_ = fVar143 * 0.5;
            fVar125 = auVar57._4_4_;
            auVar170._4_4_ = fVar125 * 0.5;
            fVar126 = auVar57._8_4_;
            auVar170._8_4_ = fVar126 * 0.5;
            fVar127 = auVar57._12_4_;
            auVar170._12_4_ = fVar127 * 0.5;
            auVar65 = vsubps_avx(auVar138,auVar170);
            local_368._0_4_ = fVar128 * -0.0 + fVar97 * -0.0 + fVar109 * 0.0 + fVar88;
            local_368._4_4_ = fVar133 * -0.0 + fVar106 * -0.0 + fVar118 * 0.0 + fVar74;
            fStack_360 = fVar135 * -0.0 + fVar107 * -0.0 + fVar119 * 0.0 + fVar75;
            fStack_35c = fVar136 * -0.0 + fVar108 * -0.0 + fVar120 * 0.0 + fVar76;
            auVar121._0_4_ = fVar128 * -0.0 + fVar88 * 0.0 + fVar97 * -0.0 + fVar109;
            auVar121._4_4_ = fVar133 * -0.0 + fVar74 * 0.0 + fVar106 * -0.0 + fVar118;
            auVar121._8_4_ = fVar135 * -0.0 + fVar75 * 0.0 + fVar107 * -0.0 + fVar119;
            auVar121._12_4_ = fVar136 * -0.0 + fVar76 * 0.0 + fVar108 * -0.0 + fVar120;
            auVar111._0_4_ = fVar109 * 0.0 + fVar97 * 0.5;
            auVar111._4_4_ = fVar118 * 0.0 + fVar106 * 0.5;
            auVar111._8_4_ = fVar119 * 0.0 + fVar107 * 0.5;
            auVar111._12_4_ = fVar120 * 0.0 + fVar108 * 0.5;
            auVar171._0_4_ = fVar144 * 0.0 + fVar96 * -0.0 + fVar51 + fVar143 * -0.0;
            auVar171._4_4_ = fVar149 * 0.0 + fVar77 * -0.0 + fVar63 + fVar125 * -0.0;
            auVar171._8_4_ = fVar151 * 0.0 + fVar86 * -0.0 + fVar64 + fVar126 * -0.0;
            auVar171._12_4_ = fVar153 * 0.0 + fVar87 * -0.0 + fVar156 + fVar127 * -0.0;
            auVar89._0_4_ = fVar88 * 0.5;
            auVar89._4_4_ = fVar74 * 0.5;
            auVar89._8_4_ = fVar75 * 0.5;
            auVar89._12_4_ = fVar76 * 0.5;
            auVar52 = vsubps_avx(auVar111,auVar89);
            auVar112._0_4_ = fVar128 * 0.0 + auVar52._0_4_;
            auVar112._4_4_ = fVar133 * 0.0 + auVar52._4_4_;
            auVar112._8_4_ = fVar135 * 0.0 + auVar52._8_4_;
            auVar112._12_4_ = fVar136 * 0.0 + auVar52._12_4_;
            auVar66._0_4_ = fVar143 * -0.0 + fVar144 + fVar96 * -0.0 + fVar51 * 0.0;
            auVar66._4_4_ = fVar125 * -0.0 + fVar149 + fVar77 * -0.0 + fVar63 * 0.0;
            auVar66._8_4_ = fVar126 * -0.0 + fVar151 + fVar86 * -0.0 + fVar64 * 0.0;
            auVar66._12_4_ = fVar127 * -0.0 + fVar153 + fVar87 * -0.0 + fVar156 * 0.0;
            auVar79._0_4_ = fVar144 * 0.0 + fVar96 * 0.5;
            auVar79._4_4_ = fVar149 * 0.0 + fVar77 * 0.5;
            auVar79._8_4_ = fVar151 * 0.0 + fVar86 * 0.5;
            auVar79._12_4_ = fVar153 * 0.0 + fVar87 * 0.5;
            auVar54._0_4_ = fVar51 * 0.5;
            auVar54._4_4_ = fVar63 * 0.5;
            auVar54._8_4_ = fVar64 * 0.5;
            auVar54._12_4_ = fVar156 * 0.5;
            auVar52 = vsubps_avx(auVar79,auVar54);
            auVar80._0_4_ = fVar143 * 0.0 + auVar52._0_4_;
            auVar80._4_4_ = fVar125 * 0.0 + auVar52._4_4_;
            auVar80._8_4_ = fVar126 * 0.0 + auVar52._8_4_;
            auVar80._12_4_ = fVar127 * 0.0 + auVar52._12_4_;
            auVar52 = vshufps_avx(auVar70,auVar70,0xc9);
            auVar102 = vshufps_avx(auVar171,auVar171,0xc9);
            fVar145 = auVar70._0_4_;
            auVar90._0_4_ = fVar145 * auVar102._0_4_;
            fVar152 = auVar70._4_4_;
            auVar90._4_4_ = fVar152 * auVar102._4_4_;
            fVar160 = auVar70._8_4_;
            auVar90._8_4_ = fVar160 * auVar102._8_4_;
            fVar162 = auVar70._12_4_;
            auVar90._12_4_ = fVar162 * auVar102._12_4_;
            auVar98._0_4_ = auVar171._0_4_ * auVar52._0_4_;
            auVar98._4_4_ = auVar171._4_4_ * auVar52._4_4_;
            auVar98._8_4_ = auVar171._8_4_ * auVar52._8_4_;
            auVar98._12_4_ = auVar171._12_4_ * auVar52._12_4_;
            auVar102 = vsubps_avx(auVar98,auVar90);
            auVar54 = vshufps_avx(auVar102,auVar102,0xc9);
            auVar102 = vshufps_avx(auVar65,auVar65,0xc9);
            auVar99._0_4_ = fVar145 * auVar102._0_4_;
            auVar99._4_4_ = fVar152 * auVar102._4_4_;
            auVar99._8_4_ = fVar160 * auVar102._8_4_;
            auVar99._12_4_ = fVar162 * auVar102._12_4_;
            auVar55._0_4_ = auVar65._0_4_ * auVar52._0_4_;
            auVar55._4_4_ = auVar65._4_4_ * auVar52._4_4_;
            auVar55._8_4_ = auVar65._8_4_ * auVar52._8_4_;
            auVar55._12_4_ = auVar65._12_4_ * auVar52._12_4_;
            auVar52 = vsubps_avx(auVar55,auVar99);
            auVar55 = vshufps_avx(auVar52,auVar52,0xc9);
            auVar52 = vshufps_avx(auVar112,auVar112,0xc9);
            auVar102 = vshufps_avx(auVar66,auVar66,0xc9);
            auVar56._0_4_ = auVar112._0_4_ * auVar102._0_4_;
            auVar56._4_4_ = auVar112._4_4_ * auVar102._4_4_;
            auVar56._8_4_ = auVar112._8_4_ * auVar102._8_4_;
            auVar56._12_4_ = auVar112._12_4_ * auVar102._12_4_;
            auVar67._0_4_ = auVar66._0_4_ * auVar52._0_4_;
            auVar67._4_4_ = auVar66._4_4_ * auVar52._4_4_;
            auVar67._8_4_ = auVar66._8_4_ * auVar52._8_4_;
            auVar67._12_4_ = auVar66._12_4_ * auVar52._12_4_;
            auVar102 = vsubps_avx(auVar67,auVar56);
            auVar56 = vshufps_avx(auVar102,auVar102,0xc9);
            auVar102 = vshufps_avx(auVar80,auVar80,0xc9);
            auVar68._0_4_ = auVar112._0_4_ * auVar102._0_4_;
            auVar68._4_4_ = auVar112._4_4_ * auVar102._4_4_;
            auVar68._8_4_ = auVar112._8_4_ * auVar102._8_4_;
            auVar68._12_4_ = auVar112._12_4_ * auVar102._12_4_;
            auVar81._0_4_ = auVar80._0_4_ * auVar52._0_4_;
            auVar81._4_4_ = auVar80._4_4_ * auVar52._4_4_;
            auVar81._8_4_ = auVar80._8_4_ * auVar52._8_4_;
            auVar81._12_4_ = auVar80._12_4_ * auVar52._12_4_;
            auVar52 = vsubps_avx(auVar81,auVar68);
            auVar57 = vshufps_avx(auVar52,auVar52,0xc9);
            auVar102 = vdpps_avx(auVar54,auVar54,0x7f);
            auVar52 = vblendps_avx(auVar102,_DAT_01feba10,0xe);
            auVar65 = vrsqrtss_avx(auVar52,auVar52);
            fVar88 = auVar65._0_4_;
            auVar65 = vdpps_avx(auVar54,auVar55,0x7f);
            auVar58 = ZEXT416((uint)(fVar88 * 1.5 - auVar102._0_4_ * 0.5 * fVar88 * fVar88 * fVar88)
                             );
            auVar58 = vshufps_avx(auVar58,auVar58,0);
            fVar88 = auVar58._0_4_ * auVar54._0_4_;
            fVar74 = auVar58._4_4_ * auVar54._4_4_;
            fVar75 = auVar58._8_4_ * auVar54._8_4_;
            fVar76 = auVar58._12_4_ * auVar54._12_4_;
            auVar66 = vshufps_avx(auVar102,auVar102,0);
            auVar100._0_4_ = auVar66._0_4_ * auVar55._0_4_;
            auVar100._4_4_ = auVar66._4_4_ * auVar55._4_4_;
            auVar100._8_4_ = auVar66._8_4_ * auVar55._8_4_;
            auVar100._12_4_ = auVar66._12_4_ * auVar55._12_4_;
            auVar65 = vshufps_avx(auVar65,auVar65,0);
            auVar91._0_4_ = auVar65._0_4_ * auVar54._0_4_;
            auVar91._4_4_ = auVar65._4_4_ * auVar54._4_4_;
            auVar91._8_4_ = auVar65._8_4_ * auVar54._8_4_;
            auVar91._12_4_ = auVar65._12_4_ * auVar54._12_4_;
            auVar67 = vsubps_avx(auVar100,auVar91);
            auVar52 = vrcpss_avx(auVar52,auVar52);
            auVar52 = ZEXT416((uint)(auVar52._0_4_ * (2.0 - auVar102._0_4_ * auVar52._0_4_)));
            auVar54 = vshufps_avx(auVar52,auVar52,0);
            auVar102 = vdpps_avx(auVar56,auVar56,0x7f);
            auVar52 = vblendps_avx(auVar102,_DAT_01feba10,0xe);
            auVar65 = vrsqrtss_avx(auVar52,auVar52);
            fVar144 = auVar65._0_4_;
            auVar65 = ZEXT416((uint)(fVar144 * 1.5 -
                                    auVar102._0_4_ * 0.5 * fVar144 * fVar144 * fVar144));
            auVar55 = vshufps_avx(auVar65,auVar65,0);
            fVar144 = auVar55._0_4_ * auVar56._0_4_;
            fVar149 = auVar55._4_4_ * auVar56._4_4_;
            fVar151 = auVar55._8_4_ * auVar56._8_4_;
            fVar153 = auVar55._12_4_ * auVar56._12_4_;
            auVar65 = vdpps_avx(auVar56,auVar57,0x7f);
            auVar66 = vshufps_avx(auVar102,auVar102,0);
            auVar82._0_4_ = auVar66._0_4_ * auVar57._0_4_;
            auVar82._4_4_ = auVar66._4_4_ * auVar57._4_4_;
            auVar82._8_4_ = auVar66._8_4_ * auVar57._8_4_;
            auVar82._12_4_ = auVar66._12_4_ * auVar57._12_4_;
            auVar65 = vshufps_avx(auVar65,auVar65,0);
            auVar57._0_4_ = auVar65._0_4_ * auVar56._0_4_;
            auVar57._4_4_ = auVar65._4_4_ * auVar56._4_4_;
            auVar57._8_4_ = auVar65._8_4_ * auVar56._8_4_;
            auVar57._12_4_ = auVar65._12_4_ * auVar56._12_4_;
            auVar56 = vsubps_avx(auVar82,auVar57);
            auVar52 = vrcpss_avx(auVar52,auVar52);
            auVar52 = ZEXT416((uint)(auVar52._0_4_ * (2.0 - auVar102._0_4_ * auVar52._0_4_)));
            auVar52 = vshufps_avx(auVar52,auVar52,0);
            auVar102 = vshufps_avx(_local_368,_local_368,0xff);
            auVar130._0_4_ = auVar102._0_4_ * fVar88;
            auVar130._4_4_ = auVar102._4_4_ * fVar74;
            auVar130._8_4_ = auVar102._8_4_ * fVar75;
            auVar130._12_4_ = auVar102._12_4_ * fVar76;
            auVar57 = vsubps_avx(_local_368,auVar130);
            auVar65 = vshufps_avx(auVar70,auVar70,0xff);
            auVar69._0_4_ =
                 auVar65._0_4_ * fVar88 +
                 auVar102._0_4_ * auVar58._0_4_ * auVar67._0_4_ * auVar54._0_4_;
            auVar69._4_4_ =
                 auVar65._4_4_ * fVar74 +
                 auVar102._4_4_ * auVar58._4_4_ * auVar67._4_4_ * auVar54._4_4_;
            auVar69._8_4_ =
                 auVar65._8_4_ * fVar75 +
                 auVar102._8_4_ * auVar58._8_4_ * auVar67._8_4_ * auVar54._8_4_;
            auVar69._12_4_ =
                 auVar65._12_4_ * fVar76 +
                 auVar102._12_4_ * auVar58._12_4_ * auVar67._12_4_ * auVar54._12_4_;
            auVar54 = vsubps_avx(auVar70,auVar69);
            local_368._0_4_ = (float)local_368._0_4_ + auVar130._0_4_;
            local_368._4_4_ = (float)local_368._4_4_ + auVar130._4_4_;
            fStack_360 = fStack_360 + auVar130._8_4_;
            fStack_35c = fStack_35c + auVar130._12_4_;
            auVar102 = vshufps_avx(auVar121,auVar121,0xff);
            auVar131._0_4_ = fVar144 * auVar102._0_4_;
            auVar131._4_4_ = fVar149 * auVar102._4_4_;
            auVar131._8_4_ = fVar151 * auVar102._8_4_;
            auVar131._12_4_ = fVar153 * auVar102._12_4_;
            auVar58 = vsubps_avx(auVar121,auVar131);
            auVar65 = vshufps_avx(auVar112,auVar112,0xff);
            auVar70._0_4_ =
                 auVar65._0_4_ * fVar144 +
                 auVar102._0_4_ * auVar55._0_4_ * auVar56._0_4_ * auVar52._0_4_;
            auVar70._4_4_ =
                 auVar65._4_4_ * fVar149 +
                 auVar102._4_4_ * auVar55._4_4_ * auVar56._4_4_ * auVar52._4_4_;
            auVar70._8_4_ =
                 auVar65._8_4_ * fVar151 +
                 auVar102._8_4_ * auVar55._8_4_ * auVar56._8_4_ * auVar52._8_4_;
            auVar70._12_4_ =
                 auVar65._12_4_ * fVar153 +
                 auVar102._12_4_ * auVar55._12_4_ * auVar56._12_4_ * auVar52._12_4_;
            auVar52 = vsubps_avx(auVar112,auVar70);
            local_348._4_4_ = auVar121._4_4_ + auVar131._4_4_;
            local_348._0_4_ = auVar121._0_4_ + auVar131._0_4_;
            fStack_340 = auVar121._8_4_ + auVar131._8_4_;
            fStack_33c = auVar121._12_4_ + auVar131._12_4_;
            auVar71._0_4_ = auVar57._0_4_ + auVar54._0_4_ * 0.33333334;
            auVar71._4_4_ = auVar57._4_4_ + auVar54._4_4_ * 0.33333334;
            auVar71._8_4_ = auVar57._8_4_ + auVar54._8_4_ * 0.33333334;
            auVar71._12_4_ = auVar57._12_4_ + auVar54._12_4_ * 0.33333334;
            auVar92._0_4_ = auVar52._0_4_ * 0.33333334;
            auVar92._4_4_ = auVar52._4_4_ * 0.33333334;
            auVar92._8_4_ = auVar52._8_4_ * 0.33333334;
            auVar92._12_4_ = auVar52._12_4_ * 0.33333334;
            auVar65 = vsubps_avx(auVar58,auVar92);
            auVar52 = vshufps_avx(auVar65,auVar65,0);
            auVar102 = vshufps_avx(auVar65,auVar65,0x55);
            auVar65 = vshufps_avx(auVar65,auVar65,0xaa);
            auVar54 = vshufps_avx(auVar58,auVar58,0);
            auVar55 = vshufps_avx(auVar58,auVar58,0x55);
            auVar56 = vshufps_avx(auVar58,auVar58,0xaa);
            fStack_168 = (float)bezier_basis0._3960_8_;
            fStack_164 = SUB84(bezier_basis0._3960_8_,4);
            fStack_160 = (float)bezier_basis0._3968_8_;
            fVar109 = auVar54._0_4_;
            fVar118 = auVar54._4_4_;
            fVar119 = auVar54._8_4_;
            fVar120 = auVar54._12_4_;
            fVar87 = auVar55._0_4_;
            fVar51 = auVar55._4_4_;
            fVar63 = auVar55._8_4_;
            fVar64 = auVar55._12_4_;
            fVar97 = auVar56._0_4_;
            fVar106 = auVar56._4_4_;
            fVar107 = auVar56._8_4_;
            fVar108 = auVar56._12_4_;
            fStack_1e8 = (float)bezier_basis0._2804_8_;
            fStack_1e4 = SUB84(bezier_basis0._2804_8_,4);
            fStack_1e0 = (float)bezier_basis0._2812_8_;
            fVar128 = auVar52._0_4_;
            fVar133 = auVar52._4_4_;
            fVar135 = auVar52._8_4_;
            fVar136 = auVar52._12_4_;
            fVar88 = auVar102._0_4_;
            fVar75 = auVar102._4_4_;
            fVar144 = auVar102._8_4_;
            fVar153 = auVar65._0_4_;
            fVar96 = auVar65._4_4_;
            fVar77 = auVar65._8_4_;
            fVar86 = auVar65._12_4_;
            auVar52 = vshufps_avx(auVar71,auVar71,0);
            local_1d8._0_4_ = (undefined4)bezier_basis0._1632_8_;
            local_1d8._4_4_ = SUB84(bezier_basis0._1632_8_,4);
            fStack_1d0 = (float)bezier_basis0._1640_8_;
            fStack_1cc = SUB84(bezier_basis0._1640_8_,4);
            fStack_1c8 = (float)bezier_basis0._1648_8_;
            fStack_1c4 = SUB84(bezier_basis0._1648_8_,4);
            fStack_1c0 = (float)bezier_basis0._1656_8_;
            fVar169 = auVar52._0_4_;
            fVar173 = auVar52._4_4_;
            fVar174 = auVar52._8_4_;
            auVar65 = vshufps_avx(auVar71,auVar71,0x55);
            fVar163 = auVar65._0_4_;
            fVar165 = auVar65._4_4_;
            fVar166 = auVar65._8_4_;
            auVar54 = vshufps_avx(auVar71,auVar71,0xaa);
            fVar150 = auVar54._0_4_;
            fVar158 = auVar54._4_4_;
            fVar161 = auVar54._8_4_;
            fVar156 = fVar136 + 0.0 + 0.0;
            auVar55 = vshufps_avx(auVar57,auVar57,0);
            local_2d8 = (float)bezier_basis0._476_8_;
            fStack_2d4 = SUB84(bezier_basis0._476_8_,4);
            fStack_2d0 = (float)bezier_basis0._484_8_;
            fStack_2cc = SUB84(bezier_basis0._484_8_,4);
            fStack_2c8 = (float)bezier_basis0._492_8_;
            fStack_2c4 = SUB84(bezier_basis0._492_8_,4);
            fStack_2c0 = (float)bezier_basis0._500_8_;
            fVar74 = auVar55._0_4_;
            fVar76 = auVar55._4_4_;
            fVar149 = auVar55._8_4_;
            fVar151 = auVar55._12_4_;
            auVar167._0_4_ =
                 fVar74 * local_2d8 +
                 fVar169 * (float)local_1d8._0_4_ + fVar128 * local_1f8 + fVar109 * local_178;
            auVar167._4_4_ =
                 fVar76 * fStack_2d4 +
                 fVar173 * (float)local_1d8._4_4_ + fVar133 * fStack_1f4 + fVar118 * fStack_174;
            auVar167._8_4_ =
                 fVar149 * fStack_2d0 +
                 fVar174 * fStack_1d0 + fVar135 * fStack_1f0 + fVar119 * fStack_170;
            auVar167._12_4_ =
                 fVar151 * fStack_2cc +
                 auVar52._12_4_ * fStack_1cc + fVar136 * fStack_1ec + fVar120 * fStack_16c;
            auVar167._16_4_ =
                 fVar74 * fStack_2c8 +
                 fVar169 * fStack_1c8 + fVar128 * fStack_1e8 + fVar109 * fStack_168;
            auVar167._20_4_ =
                 fVar76 * fStack_2c4 +
                 fVar173 * fStack_1c4 + fVar133 * fStack_1e4 + fVar118 * fStack_164;
            auVar167._24_4_ =
                 fVar149 * fStack_2c0 +
                 fVar174 * fStack_1c0 + fVar135 * fStack_1e0 + fVar119 * fStack_160;
            auVar167._28_4_ = fVar136 + 0.0 + 0.0 + 0.0;
            auVar55 = vshufps_avx(auVar57,auVar57,0x55);
            fVar125 = auVar55._0_4_;
            fVar126 = auVar55._4_4_;
            fVar127 = auVar55._8_4_;
            auVar83._0_4_ =
                 fVar125 * local_2d8 +
                 fVar163 * (float)local_1d8._0_4_ + fVar88 * local_1f8 + fVar87 * local_178;
            auVar83._4_4_ =
                 fVar126 * fStack_2d4 +
                 fVar165 * (float)local_1d8._4_4_ + fVar75 * fStack_1f4 + fVar51 * fStack_174;
            auVar83._8_4_ =
                 fVar127 * fStack_2d0 +
                 fVar166 * fStack_1d0 + fVar144 * fStack_1f0 + fVar63 * fStack_170;
            auVar83._12_4_ =
                 auVar55._12_4_ * fStack_2cc +
                 auVar65._12_4_ * fStack_1cc + auVar102._12_4_ * fStack_1ec + fVar64 * fStack_16c;
            auVar83._16_4_ =
                 fVar125 * fStack_2c8 +
                 fVar163 * fStack_1c8 + fVar88 * fStack_1e8 + fVar87 * fStack_168;
            auVar83._20_4_ =
                 fVar126 * fStack_2c4 +
                 fVar165 * fStack_1c4 + fVar75 * fStack_1e4 + fVar51 * fStack_164;
            auVar83._24_4_ =
                 fVar127 * fStack_2c0 +
                 fVar166 * fStack_1c0 + fVar144 * fStack_1e0 + fVar63 * fStack_160;
            auVar83._28_4_ = fVar136 + 0.0 + 0.0 + 0.0;
            auVar56 = vshufps_avx(auVar57,auVar57,0xaa);
            fVar140 = auVar56._0_4_;
            fVar141 = auVar56._4_4_;
            fVar142 = auVar56._8_4_;
            auVar93._0_4_ =
                 fVar153 * local_1f8 + fVar97 * local_178 + fVar150 * (float)local_1d8._0_4_ +
                 fVar140 * local_2d8;
            auVar93._4_4_ =
                 fVar96 * fStack_1f4 + fVar106 * fStack_174 + fVar158 * (float)local_1d8._4_4_ +
                 fVar141 * fStack_2d4;
            auVar93._8_4_ =
                 fVar77 * fStack_1f0 + fVar107 * fStack_170 + fVar161 * fStack_1d0 +
                 fVar142 * fStack_2d0;
            auVar93._12_4_ =
                 fVar86 * fStack_1ec + fVar108 * fStack_16c + auVar54._12_4_ * fStack_1cc +
                 auVar56._12_4_ * fStack_2cc;
            auVar93._16_4_ =
                 fVar153 * fStack_1e8 + fVar97 * fStack_168 + fVar150 * fStack_1c8 +
                 fVar140 * fStack_2c8;
            auVar93._20_4_ =
                 fVar96 * fStack_1e4 + fVar106 * fStack_164 + fVar158 * fStack_1c4 +
                 fVar141 * fStack_2c4;
            auVar93._24_4_ =
                 fVar77 * fStack_1e0 + fVar107 * fStack_160 + fVar161 * fStack_1c0 +
                 fVar142 * fStack_2c0;
            auVar93._28_4_ = fVar156 + 0.0;
            local_d8 = (float)bezier_basis0._8568_8_;
            fStack_d4 = SUB84(bezier_basis0._8568_8_,4);
            fStack_d0 = (float)bezier_basis0._8576_8_;
            fStack_cc = SUB84(bezier_basis0._8576_8_,4);
            fStack_c8 = (float)bezier_basis0._8584_8_;
            fStack_c4 = SUB84(bezier_basis0._8584_8_,4);
            fStack_c0 = (float)bezier_basis0._8592_8_;
            fVar143 = fVar156 + fVar120;
            local_198 = (float)bezier_basis0._6256_8_;
            fStack_194 = SUB84(bezier_basis0._6256_8_,4);
            fStack_190 = (float)bezier_basis0._6264_8_;
            fStack_18c = SUB84(bezier_basis0._6264_8_,4);
            fStack_188 = (float)bezier_basis0._6272_8_;
            fStack_184 = SUB84(bezier_basis0._6272_8_,4);
            fStack_180 = (float)bezier_basis0._6280_8_;
            fStack_17c = SUB84(bezier_basis0._6280_8_,4);
            fVar156 = fVar143 + fVar156 + fVar64;
            local_1b8 = (float)bezier_basis0._5100_8_;
            fStack_1b4 = SUB84(bezier_basis0._5100_8_,4);
            fStack_1b0 = (float)bezier_basis0._5108_8_;
            fStack_1ac = SUB84(bezier_basis0._5108_8_,4);
            fStack_1a8 = (float)bezier_basis0._5116_8_;
            fStack_1a4 = SUB84(bezier_basis0._5116_8_,4);
            fStack_1a0 = (float)bezier_basis0._5124_8_;
            auVar103._0_4_ =
                 fVar74 * local_1b8 + local_b8 * fVar128 + fVar109 * local_d8 + fVar169 * local_198;
            auVar103._4_4_ =
                 fVar76 * fStack_1b4 +
                 fStack_b4 * fVar133 + fVar118 * fStack_d4 + fVar173 * fStack_194;
            auVar103._8_4_ =
                 fVar149 * fStack_1b0 +
                 fStack_b0 * fVar135 + fVar119 * fStack_d0 + fVar174 * fStack_190;
            auVar103._12_4_ =
                 fVar151 * fStack_1ac +
                 fStack_ac * fVar136 + fVar120 * fStack_cc + auVar52._12_4_ * fStack_18c;
            auVar103._16_4_ =
                 fVar74 * fStack_1a8 +
                 fStack_a8 * fVar128 + fVar109 * fStack_c8 + fVar169 * fStack_188;
            auVar103._20_4_ =
                 fVar76 * fStack_1a4 +
                 fStack_a4 * fVar133 + fVar118 * fStack_c4 + fVar173 * fStack_184;
            auVar103._24_4_ =
                 fVar149 * fStack_1a0 +
                 fStack_a0 * fVar135 + fVar119 * fStack_c0 + fVar174 * fStack_180;
            auVar103._28_4_ = fVar151 + fVar143 + fVar108;
            auVar60._0_4_ =
                 fVar125 * local_1b8 + fVar163 * local_198 + local_b8 * fVar88 + fVar87 * local_d8;
            auVar60._4_4_ =
                 fVar126 * fStack_1b4 +
                 fVar165 * fStack_194 + fStack_b4 * fVar75 + fVar51 * fStack_d4;
            auVar60._8_4_ =
                 fVar127 * fStack_1b0 +
                 fVar166 * fStack_190 + fStack_b0 * fVar144 + fVar63 * fStack_d0;
            auVar60._12_4_ =
                 auVar55._12_4_ * fStack_1ac +
                 auVar65._12_4_ * fStack_18c + fStack_ac * auVar102._12_4_ + fVar64 * fStack_cc;
            auVar60._16_4_ =
                 fVar125 * fStack_1a8 +
                 fVar163 * fStack_188 + fStack_a8 * fVar88 + fVar87 * fStack_c8;
            auVar60._20_4_ =
                 fVar126 * fStack_1a4 +
                 fVar165 * fStack_184 + fStack_a4 * fVar75 + fVar51 * fStack_c4;
            auVar60._24_4_ =
                 fVar127 * fStack_1a0 +
                 fVar166 * fStack_180 + fStack_a0 * fVar144 + fVar63 * fStack_c0;
            auVar60._28_4_ = fStack_17c + fVar156;
            auVar115._0_4_ =
                 fVar140 * local_1b8 + fVar150 * local_198 + fVar153 * local_b8 + fVar97 * local_d8;
            auVar115._4_4_ =
                 fVar141 * fStack_1b4 +
                 fVar158 * fStack_194 + fVar96 * fStack_b4 + fVar106 * fStack_d4;
            auVar115._8_4_ =
                 fVar142 * fStack_1b0 +
                 fVar161 * fStack_190 + fVar77 * fStack_b0 + fVar107 * fStack_d0;
            auVar115._12_4_ =
                 auVar56._12_4_ * fStack_1ac +
                 auVar54._12_4_ * fStack_18c + fVar86 * fStack_ac + fVar108 * fStack_cc;
            auVar115._16_4_ =
                 fVar140 * fStack_1a8 +
                 fVar150 * fStack_188 + fVar153 * fStack_a8 + fVar97 * fStack_c8;
            auVar115._20_4_ =
                 fVar141 * fStack_1a4 +
                 fVar158 * fStack_184 + fVar96 * fStack_a4 + fVar106 * fStack_c4;
            auVar115._24_4_ =
                 fVar142 * fStack_1a0 +
                 fVar161 * fStack_180 + fVar77 * fStack_a0 + fVar107 * fStack_c0;
            auVar115._28_4_ = fVar156 + fVar143 + fVar86 + fVar108;
            auVar154 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar11 = vblendps_avx(auVar103,auVar154,1);
            auVar154 = vblendps_avx(auVar60,auVar154,1);
            auVar155 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar148 = vblendps_avx(auVar115,auVar155,1);
            auVar132._4_4_ = auVar11._4_4_ * 0.055555556;
            auVar132._0_4_ = auVar11._0_4_ * 0.055555556;
            auVar132._8_4_ = auVar11._8_4_ * 0.055555556;
            auVar132._12_4_ = auVar11._12_4_ * 0.055555556;
            auVar132._16_4_ = auVar11._16_4_ * 0.055555556;
            auVar132._20_4_ = auVar11._20_4_ * 0.055555556;
            auVar132._24_4_ = auVar11._24_4_ * 0.055555556;
            auVar132._28_4_ = auVar11._28_4_;
            auVar11._4_4_ = auVar154._4_4_ * 0.055555556;
            auVar11._0_4_ = auVar154._0_4_ * 0.055555556;
            auVar11._8_4_ = auVar154._8_4_ * 0.055555556;
            auVar11._12_4_ = auVar154._12_4_ * 0.055555556;
            auVar11._16_4_ = auVar154._16_4_ * 0.055555556;
            auVar11._20_4_ = auVar154._20_4_ * 0.055555556;
            auVar11._24_4_ = auVar154._24_4_ * 0.055555556;
            auVar11._28_4_ = auVar154._28_4_;
            auVar154._4_4_ = auVar148._4_4_ * 0.055555556;
            auVar154._0_4_ = auVar148._0_4_ * 0.055555556;
            auVar154._8_4_ = auVar148._8_4_ * 0.055555556;
            auVar154._12_4_ = auVar148._12_4_ * 0.055555556;
            auVar154._16_4_ = auVar148._16_4_ * 0.055555556;
            auVar154._20_4_ = auVar148._20_4_ * 0.055555556;
            auVar154._24_4_ = auVar148._24_4_ * 0.055555556;
            auVar154._28_4_ = auVar148._28_4_;
            auVar132 = vsubps_avx(auVar167,auVar132);
            auVar105 = vsubps_avx(auVar83,auVar11);
            auVar18 = vsubps_avx(auVar93,auVar154);
            auVar11 = vblendps_avx(auVar103,auVar155,0x80);
            auVar154 = vblendps_avx(auVar60,auVar155,0x80);
            auVar148 = vblendps_avx(auVar115,auVar155,0x80);
            auVar104._0_4_ = auVar167._0_4_ + auVar11._0_4_ * 0.055555556;
            auVar104._4_4_ = auVar167._4_4_ + auVar11._4_4_ * 0.055555556;
            auVar104._8_4_ = auVar167._8_4_ + auVar11._8_4_ * 0.055555556;
            auVar104._12_4_ = auVar167._12_4_ + auVar11._12_4_ * 0.055555556;
            auVar104._16_4_ = auVar167._16_4_ + auVar11._16_4_ * 0.055555556;
            auVar104._20_4_ = auVar167._20_4_ + auVar11._20_4_ * 0.055555556;
            auVar104._24_4_ = auVar167._24_4_ + auVar11._24_4_ * 0.055555556;
            auVar104._28_4_ = auVar167._28_4_ + auVar11._28_4_;
            auVar147._0_4_ = auVar83._0_4_ + auVar154._0_4_ * 0.055555556;
            auVar147._4_4_ = auVar83._4_4_ + auVar154._4_4_ * 0.055555556;
            auVar147._8_4_ = auVar83._8_4_ + auVar154._8_4_ * 0.055555556;
            auVar147._12_4_ = auVar83._12_4_ + auVar154._12_4_ * 0.055555556;
            auVar147._16_4_ = auVar83._16_4_ + auVar154._16_4_ * 0.055555556;
            auVar147._20_4_ = auVar83._20_4_ + auVar154._20_4_ * 0.055555556;
            auVar147._24_4_ = auVar83._24_4_ + auVar154._24_4_ * 0.055555556;
            auVar147._28_4_ = auVar83._28_4_ + auVar154._28_4_;
            auVar116._0_4_ = auVar93._0_4_ + auVar148._0_4_ * 0.055555556;
            auVar116._4_4_ = auVar93._4_4_ + auVar148._4_4_ * 0.055555556;
            auVar116._8_4_ = auVar93._8_4_ + auVar148._8_4_ * 0.055555556;
            auVar116._12_4_ = auVar93._12_4_ + auVar148._12_4_ * 0.055555556;
            auVar116._16_4_ = auVar93._16_4_ + auVar148._16_4_ * 0.055555556;
            auVar116._20_4_ = auVar93._20_4_ + auVar148._20_4_ * 0.055555556;
            auVar116._24_4_ = auVar93._24_4_ + auVar148._24_4_ * 0.055555556;
            auVar116._28_4_ = auVar93._28_4_ + auVar148._28_4_;
            auVar72._8_4_ = 0x7f800000;
            auVar72._0_8_ = 0x7f8000007f800000;
            auVar72._12_4_ = 0x7f800000;
            auVar72._16_4_ = 0x7f800000;
            auVar72._20_4_ = 0x7f800000;
            auVar72._24_4_ = 0x7f800000;
            auVar72._28_4_ = 0x7f800000;
            auVar11 = vminps_avx(auVar72,auVar167);
            auVar154 = vminps_avx(auVar72,auVar83);
            auVar148 = vminps_avx(auVar132,auVar104);
            auVar155 = vminps_avx(auVar11,auVar148);
            auVar11 = vminps_avx(auVar105,auVar147);
            auVar16 = vminps_avx(auVar154,auVar11);
            auVar11 = vminps_avx(auVar72,auVar93);
            auVar154 = vminps_avx(auVar18,auVar116);
            auVar17 = vminps_avx(auVar11,auVar154);
            auVar172._0_4_ = (fVar145 + auVar69._0_4_) * 0.33333334 + (float)local_368._0_4_;
            auVar172._4_4_ = (fVar152 + auVar69._4_4_) * 0.33333334 + (float)local_368._4_4_;
            auVar172._8_4_ = (fVar160 + auVar69._8_4_) * 0.33333334 + fStack_360;
            auVar172._12_4_ = (fVar162 + auVar69._12_4_) * 0.33333334 + fStack_35c;
            auVar58._0_4_ = (auVar112._0_4_ + auVar70._0_4_) * 0.33333334;
            auVar58._4_4_ = (auVar112._4_4_ + auVar70._4_4_) * 0.33333334;
            auVar58._8_4_ = (auVar112._8_4_ + auVar70._8_4_) * 0.33333334;
            auVar58._12_4_ = (auVar112._12_4_ + auVar70._12_4_) * 0.33333334;
            auVar58 = vsubps_avx(_local_348,auVar58);
            auVar164._8_4_ = 0xff800000;
            auVar164._0_8_ = 0xff800000ff800000;
            auVar164._12_4_ = 0xff800000;
            auVar164._16_4_ = 0xff800000;
            auVar164._20_4_ = 0xff800000;
            auVar164._24_4_ = 0xff800000;
            auVar164._28_4_ = 0xff800000;
            auVar11 = vmaxps_avx(auVar164,auVar167);
            auVar154 = vmaxps_avx(auVar164,auVar83);
            auVar148 = vmaxps_avx(auVar164,auVar93);
            auVar132 = vmaxps_avx(auVar132,auVar104);
            auVar11 = vmaxps_avx(auVar11,auVar132);
            auVar132 = vmaxps_avx(auVar105,auVar147);
            auVar154 = vmaxps_avx(auVar154,auVar132);
            auVar132 = vmaxps_avx(auVar18,auVar116);
            auVar148 = vmaxps_avx(auVar148,auVar132);
            auVar132 = vshufps_avx(auVar155,auVar155,0xb1);
            auVar132 = vminps_avx(auVar155,auVar132);
            auVar105 = vshufpd_avx(auVar132,auVar132,5);
            auVar132 = vminps_avx(auVar132,auVar105);
            auVar52 = vminps_avx(auVar132._0_16_,auVar132._16_16_);
            auVar132 = vshufps_avx(auVar16,auVar16,0xb1);
            auVar132 = vminps_avx(auVar16,auVar132);
            auVar105 = vshufpd_avx(auVar132,auVar132,5);
            auVar132 = vminps_avx(auVar132,auVar105);
            auVar102 = vminps_avx(auVar132._0_16_,auVar132._16_16_);
            auVar102 = vunpcklps_avx(auVar52,auVar102);
            auVar132 = vshufps_avx(auVar17,auVar17,0xb1);
            auVar132 = vminps_avx(auVar17,auVar132);
            auVar17 = vshufpd_avx(auVar132,auVar132,5);
            auVar132 = vminps_avx(auVar132,auVar17);
            auVar52 = vminps_avx(auVar132._0_16_,auVar132._16_16_);
            auVar52 = vinsertps_avx(auVar102,auVar52,0x28);
            auVar132 = vshufps_avx(auVar11,auVar11,0xb1);
            auVar11 = vmaxps_avx(auVar11,auVar132);
            auVar132 = vshufpd_avx(auVar11,auVar11,5);
            auVar11 = vmaxps_avx(auVar11,auVar132);
            auVar102 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
            auVar11 = vshufps_avx(auVar154,auVar154,0xb1);
            auVar11 = vmaxps_avx(auVar154,auVar11);
            auVar154 = vshufpd_avx(auVar11,auVar11,5);
            auVar11 = vmaxps_avx(auVar11,auVar154);
            auVar65 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
            auVar65 = vunpcklps_avx(auVar102,auVar65);
            auVar11 = vshufps_avx(auVar148,auVar148,0xb1);
            auVar11 = vmaxps_avx(auVar148,auVar11);
            auVar154 = vshufpd_avx(auVar11,auVar11,5);
            auVar11 = vmaxps_avx(auVar11,auVar154);
            auVar102 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
            auVar102 = vinsertps_avx(auVar65,auVar102,0x28);
            auVar65 = vshufps_avx(auVar172,auVar172,0);
            auVar54 = vshufps_avx(auVar172,auVar172,0x55);
            local_f8._16_16_ = auVar54;
            local_f8._0_16_ = auVar54;
            auVar55 = vshufps_avx(auVar172,auVar172,0xaa);
            local_118._16_16_ = auVar55;
            local_118._0_16_ = auVar55;
            auVar56 = vshufps_avx(auVar58,auVar58,0);
            auVar57 = vshufps_avx(auVar58,auVar58,0x55);
            auVar58 = vshufps_avx(auVar58,auVar58,0xaa);
            auVar66 = vshufps_avx(_local_348,_local_348,0);
            auVar70 = vshufps_avx(_local_348,_local_348,0x55);
            auVar67 = vshufps_avx(_local_348,_local_348,0xaa);
            fVar136 = auVar66._0_4_;
            fVar140 = auVar66._4_4_;
            fVar141 = auVar66._8_4_;
            fVar142 = auVar66._12_4_;
            fVar143 = auVar70._0_4_;
            fVar125 = auVar70._4_4_;
            fVar126 = auVar70._8_4_;
            fVar127 = auVar70._12_4_;
            fVar128 = auVar67._0_4_;
            fVar133 = auVar67._4_4_;
            fVar135 = auVar67._8_4_;
            fVar51 = auVar56._0_4_;
            fVar63 = auVar56._4_4_;
            fVar64 = auVar56._8_4_;
            fVar156 = auVar56._12_4_;
            fVar96 = auVar155._28_4_;
            fVar97 = auVar57._0_4_;
            fVar106 = auVar57._4_4_;
            fVar107 = auVar57._8_4_;
            fVar108 = auVar57._12_4_;
            fVar109 = auVar58._0_4_;
            fVar118 = auVar58._4_4_;
            fVar119 = auVar58._8_4_;
            fVar120 = auVar58._12_4_;
            fVar158 = auVar65._0_4_;
            fVar160 = auVar65._4_4_;
            fVar161 = auVar65._8_4_;
            fVar77 = auVar54._0_4_;
            fVar86 = auVar54._4_4_;
            fVar87 = auVar54._8_4_;
            fVar162 = auVar55._0_4_;
            fVar163 = auVar55._4_4_;
            fVar165 = auVar55._8_4_;
            auVar56 = vshufps_avx(_local_368,_local_368,0);
            fVar88 = auVar56._0_4_;
            fVar75 = auVar56._4_4_;
            fVar144 = auVar56._8_4_;
            fVar151 = auVar56._12_4_;
            auVar73._0_4_ =
                 local_2d8 * fVar88 +
                 fVar158 * (float)local_1d8._0_4_ + fVar51 * local_1f8 + fVar136 * local_178;
            auVar73._4_4_ =
                 fStack_2d4 * fVar75 +
                 fVar160 * (float)local_1d8._4_4_ + fVar63 * fStack_1f4 + fVar140 * fStack_174;
            auVar73._8_4_ =
                 fStack_2d0 * fVar144 +
                 fVar161 * fStack_1d0 + fVar64 * fStack_1f0 + fVar141 * fStack_170;
            auVar73._12_4_ =
                 fStack_2cc * fVar151 +
                 auVar65._12_4_ * fStack_1cc + fVar156 * fStack_1ec + fVar142 * fStack_16c;
            auVar73._16_4_ =
                 fStack_2c8 * fVar88 +
                 fVar158 * fStack_1c8 + fVar51 * fStack_1e8 + fVar136 * fStack_168;
            auVar73._20_4_ =
                 fStack_2c4 * fVar75 +
                 fVar160 * fStack_1c4 + fVar63 * fStack_1e4 + fVar140 * fStack_164;
            auVar73._24_4_ =
                 fStack_2c0 * fVar144 +
                 fVar161 * fStack_1c0 + fVar64 * fStack_1e0 + fVar141 * fStack_160;
            auVar73._28_4_ = fVar96 + fVar96 + 0.0 + 0.0;
            auVar56 = vshufps_avx(_local_368,_local_368,0x55);
            fVar74 = auVar56._0_4_;
            fVar76 = auVar56._4_4_;
            fVar149 = auVar56._8_4_;
            fVar153 = auVar56._12_4_;
            auVar168._0_4_ =
                 local_2d8 * fVar74 +
                 fVar77 * (float)local_1d8._0_4_ + fVar97 * local_1f8 + fVar143 * local_178;
            auVar168._4_4_ =
                 fStack_2d4 * fVar76 +
                 fVar86 * (float)local_1d8._4_4_ + fVar106 * fStack_1f4 + fVar125 * fStack_174;
            auVar168._8_4_ =
                 fStack_2d0 * fVar149 +
                 fVar87 * fStack_1d0 + fVar107 * fStack_1f0 + fVar126 * fStack_170;
            auVar168._12_4_ =
                 fStack_2cc * fVar153 +
                 auVar54._12_4_ * fStack_1cc + fVar108 * fStack_1ec + fVar127 * fStack_16c;
            auVar168._16_4_ =
                 fStack_2c8 * fVar74 +
                 fVar77 * fStack_1c8 + fVar97 * fStack_1e8 + fVar143 * fStack_168;
            auVar168._20_4_ =
                 fStack_2c4 * fVar76 +
                 fVar86 * fStack_1c4 + fVar106 * fStack_1e4 + fVar125 * fStack_164;
            auVar168._24_4_ =
                 fStack_2c0 * fVar149 +
                 fVar87 * fStack_1c0 + fVar107 * fStack_1e0 + fVar126 * fStack_160;
            auVar168._28_4_ = fVar96 + fVar96 + auVar147._28_4_ + 0.0;
            auVar56 = vshufps_avx(_local_368,_local_368,0xaa);
            fVar145 = auVar56._0_4_;
            fVar150 = auVar56._4_4_;
            fVar152 = auVar56._8_4_;
            auVar157._0_4_ =
                 fVar145 * local_2d8 +
                 fVar162 * (float)local_1d8._0_4_ + fVar109 * local_1f8 + fVar128 * local_178;
            auVar157._4_4_ =
                 fVar150 * fStack_2d4 +
                 fVar163 * (float)local_1d8._4_4_ + fVar118 * fStack_1f4 + fVar133 * fStack_174;
            auVar157._8_4_ =
                 fVar152 * fStack_2d0 +
                 fVar165 * fStack_1d0 + fVar119 * fStack_1f0 + fVar135 * fStack_170;
            auVar157._12_4_ =
                 auVar56._12_4_ * fStack_2cc +
                 auVar55._12_4_ * fStack_1cc + fVar120 * fStack_1ec + auVar67._12_4_ * fStack_16c;
            auVar157._16_4_ =
                 fVar145 * fStack_2c8 +
                 fVar162 * fStack_1c8 + fVar109 * fStack_1e8 + fVar128 * fStack_168;
            auVar157._20_4_ =
                 fVar150 * fStack_2c4 +
                 fVar163 * fStack_1c4 + fVar118 * fStack_1e4 + fVar133 * fStack_164;
            auVar157._24_4_ =
                 fVar152 * fStack_2c0 +
                 fVar165 * fStack_1c0 + fVar119 * fStack_1e0 + fVar135 * fStack_160;
            auVar157._28_4_ = fVar96 + fVar96 + auVar16._28_4_ + 0.0;
            fVar96 = fVar127 + fVar142 + fVar156;
            auVar84._0_4_ =
                 fVar88 * local_1b8 + fVar158 * local_198 + fVar136 * local_d8 + local_b8 * fVar51;
            auVar84._4_4_ =
                 fVar75 * fStack_1b4 +
                 fVar160 * fStack_194 + fVar140 * fStack_d4 + fStack_b4 * fVar63;
            auVar84._8_4_ =
                 fVar144 * fStack_1b0 +
                 fVar161 * fStack_190 + fVar141 * fStack_d0 + fStack_b0 * fVar64;
            auVar84._12_4_ =
                 fVar151 * fStack_1ac +
                 auVar65._12_4_ * fStack_18c + fVar142 * fStack_cc + fStack_ac * fVar156;
            auVar84._16_4_ =
                 fVar88 * fStack_1a8 +
                 fVar158 * fStack_188 + fVar136 * fStack_c8 + fStack_a8 * fVar51;
            auVar84._20_4_ =
                 fVar75 * fStack_1a4 +
                 fVar160 * fStack_184 + fVar140 * fStack_c4 + fStack_a4 * fVar63;
            auVar84._24_4_ =
                 fVar144 * fStack_1a0 +
                 fVar161 * fStack_180 + fVar141 * fStack_c0 + fStack_a0 * fVar64;
            auVar84._28_4_ = fVar151 + fVar96;
            auVar61._0_4_ =
                 fVar74 * local_1b8 + local_198 * fVar77 + local_b8 * fVar97 + local_d8 * fVar143;
            auVar61._4_4_ =
                 fVar76 * fStack_1b4 +
                 fStack_194 * fVar86 + fStack_b4 * fVar106 + fStack_d4 * fVar125;
            auVar61._8_4_ =
                 fVar149 * fStack_1b0 +
                 fStack_190 * fVar87 + fStack_b0 * fVar107 + fStack_d0 * fVar126;
            auVar61._12_4_ =
                 fVar153 * fStack_1ac +
                 fStack_18c * auVar54._12_4_ + fStack_ac * fVar108 + fStack_cc * fVar127;
            auVar61._16_4_ =
                 fVar74 * fStack_1a8 +
                 fStack_188 * fVar77 + fStack_a8 * fVar97 + fStack_c8 * fVar143;
            auVar61._20_4_ =
                 fVar76 * fStack_1a4 +
                 fStack_184 * fVar86 + fStack_a4 * fVar106 + fStack_c4 * fVar125;
            auVar61._24_4_ =
                 fVar149 * fStack_1a0 +
                 fStack_180 * fVar87 + fStack_a0 * fVar107 + fStack_c0 * fVar126;
            auVar61._28_4_ = fVar153 + fVar127 + fVar108 + fVar127;
            auVar94._0_4_ =
                 fVar145 * local_1b8 + local_198 * fVar162 + local_b8 * fVar109 + local_d8 * fVar128
            ;
            auVar94._4_4_ =
                 fVar150 * fStack_1b4 +
                 fStack_194 * fVar163 + fStack_b4 * fVar118 + fStack_d4 * fVar133;
            auVar94._8_4_ =
                 fVar152 * fStack_1b0 +
                 fStack_190 * fVar165 + fStack_b0 * fVar119 + fStack_d0 * fVar135;
            auVar94._12_4_ =
                 auVar56._12_4_ * fStack_1ac +
                 fStack_18c * auVar55._12_4_ + fStack_ac * fVar120 + fStack_cc * auVar67._12_4_;
            auVar94._16_4_ =
                 fVar145 * fStack_1a8 +
                 fStack_188 * fVar162 + fStack_a8 * fVar109 + fStack_c8 * fVar128;
            auVar94._20_4_ =
                 fVar150 * fStack_1a4 +
                 fStack_184 * fVar163 + fStack_a4 * fVar118 + fStack_c4 * fVar133;
            auVar94._24_4_ =
                 fVar152 * fStack_1a0 +
                 fStack_180 * fVar165 + fStack_a0 * fVar119 + fStack_c0 * fVar135;
            auVar94._28_4_ = fVar96 + fVar127 + fVar120 + fVar127;
            auVar11 = vblendps_avx(auVar84,ZEXT832(0) << 0x20,1);
            auVar154 = vblendps_avx(auVar61,ZEXT832(0) << 0x20,1);
            auVar132 = ZEXT832(0) << 0x20;
            auVar148 = vblendps_avx(auVar94,auVar132,1);
            auVar155._4_4_ = auVar11._4_4_ * 0.055555556;
            auVar155._0_4_ = auVar11._0_4_ * 0.055555556;
            auVar155._8_4_ = auVar11._8_4_ * 0.055555556;
            auVar155._12_4_ = auVar11._12_4_ * 0.055555556;
            auVar155._16_4_ = auVar11._16_4_ * 0.055555556;
            auVar155._20_4_ = auVar11._20_4_ * 0.055555556;
            auVar155._24_4_ = auVar11._24_4_ * 0.055555556;
            auVar155._28_4_ = auVar11._28_4_;
            auVar16._4_4_ = auVar154._4_4_ * 0.055555556;
            auVar16._0_4_ = auVar154._0_4_ * 0.055555556;
            auVar16._8_4_ = auVar154._8_4_ * 0.055555556;
            auVar16._12_4_ = auVar154._12_4_ * 0.055555556;
            auVar16._16_4_ = auVar154._16_4_ * 0.055555556;
            auVar16._20_4_ = auVar154._20_4_ * 0.055555556;
            auVar16._24_4_ = auVar154._24_4_ * 0.055555556;
            auVar16._28_4_ = auVar154._28_4_;
            auVar17._4_4_ = auVar148._4_4_ * 0.055555556;
            auVar17._0_4_ = auVar148._0_4_ * 0.055555556;
            auVar17._8_4_ = auVar148._8_4_ * 0.055555556;
            auVar17._12_4_ = auVar148._12_4_ * 0.055555556;
            auVar17._16_4_ = auVar148._16_4_ * 0.055555556;
            auVar17._20_4_ = auVar148._20_4_ * 0.055555556;
            auVar17._24_4_ = auVar148._24_4_ * 0.055555556;
            auVar17._28_4_ = auVar148._28_4_;
            auVar105 = vsubps_avx(auVar73,auVar155);
            auVar18 = vsubps_avx(auVar168,auVar16);
            auVar60 = vsubps_avx(auVar157,auVar17);
            auVar11 = vblendps_avx(auVar84,auVar132,0x80);
            auVar154 = vblendps_avx(auVar61,auVar132,0x80);
            auVar148 = vblendps_avx(auVar94,auVar132,0x80);
            auVar85._0_4_ = auVar73._0_4_ + auVar11._0_4_ * 0.055555556;
            auVar85._4_4_ = auVar73._4_4_ + auVar11._4_4_ * 0.055555556;
            auVar85._8_4_ = auVar73._8_4_ + auVar11._8_4_ * 0.055555556;
            auVar85._12_4_ = auVar73._12_4_ + auVar11._12_4_ * 0.055555556;
            auVar85._16_4_ = auVar73._16_4_ + auVar11._16_4_ * 0.055555556;
            auVar85._20_4_ = auVar73._20_4_ + auVar11._20_4_ * 0.055555556;
            auVar85._24_4_ = auVar73._24_4_ + auVar11._24_4_ * 0.055555556;
            auVar85._28_4_ = auVar73._28_4_ + auVar11._28_4_;
            auVar62._0_4_ = auVar168._0_4_ + auVar154._0_4_ * 0.055555556;
            auVar62._4_4_ = auVar168._4_4_ + auVar154._4_4_ * 0.055555556;
            auVar62._8_4_ = auVar168._8_4_ + auVar154._8_4_ * 0.055555556;
            auVar62._12_4_ = auVar168._12_4_ + auVar154._12_4_ * 0.055555556;
            auVar62._16_4_ = auVar168._16_4_ + auVar154._16_4_ * 0.055555556;
            auVar62._20_4_ = auVar168._20_4_ + auVar154._20_4_ * 0.055555556;
            auVar62._24_4_ = auVar168._24_4_ + auVar154._24_4_ * 0.055555556;
            auVar62._28_4_ = auVar168._28_4_ + auVar154._28_4_;
            auVar95._0_4_ = auVar157._0_4_ + auVar148._0_4_ * 0.055555556;
            auVar95._4_4_ = auVar157._4_4_ + auVar148._4_4_ * 0.055555556;
            auVar95._8_4_ = auVar157._8_4_ + auVar148._8_4_ * 0.055555556;
            auVar95._12_4_ = auVar157._12_4_ + auVar148._12_4_ * 0.055555556;
            auVar95._16_4_ = auVar157._16_4_ + auVar148._16_4_ * 0.055555556;
            auVar95._20_4_ = auVar157._20_4_ + auVar148._20_4_ * 0.055555556;
            auVar95._24_4_ = auVar157._24_4_ + auVar148._24_4_ * 0.055555556;
            auVar95._28_4_ = auVar157._28_4_ + auVar148._28_4_;
            auVar148._8_4_ = 0x7f800000;
            auVar148._0_8_ = 0x7f8000007f800000;
            auVar148._12_4_ = 0x7f800000;
            auVar148._16_4_ = 0x7f800000;
            auVar148._20_4_ = 0x7f800000;
            auVar148._24_4_ = 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar11 = vminps_avx(auVar148,auVar73);
            auVar154 = vminps_avx(auVar148,auVar168);
            auVar148 = vminps_avx(auVar148,auVar157);
            auVar132 = vminps_avx(auVar105,auVar85);
            auVar155 = vminps_avx(auVar11,auVar132);
            auVar11 = vminps_avx(auVar18,auVar62);
            auVar16 = vminps_avx(auVar154,auVar11);
            auVar11 = vminps_avx(auVar60,auVar95);
            auVar17 = vminps_avx(auVar148,auVar11);
            auVar11 = vmaxps_avx(auVar105,auVar85);
            auVar105._8_4_ = 0xff800000;
            auVar105._0_8_ = 0xff800000ff800000;
            auVar105._12_4_ = 0xff800000;
            auVar105._16_4_ = 0xff800000;
            auVar105._20_4_ = 0xff800000;
            auVar105._24_4_ = 0xff800000;
            auVar105._28_4_ = 0xff800000;
            auVar154 = vmaxps_avx(auVar105,auVar73);
            auVar11 = vmaxps_avx(auVar154,auVar11);
            auVar154 = vmaxps_avx(auVar18,auVar62);
            auVar148 = vmaxps_avx(auVar105,auVar168);
            auVar154 = vmaxps_avx(auVar148,auVar154);
            auVar148 = vmaxps_avx(auVar60,auVar95);
            auVar122._8_4_ = 0xddccb9a2;
            auVar122._0_8_ = 0xddccb9a2ddccb9a2;
            auVar122._12_4_ = 0xddccb9a2;
            auVar124 = ZEXT1664(auVar122);
            auVar132 = vmaxps_avx(auVar105,auVar157);
            auVar148 = vmaxps_avx(auVar132,auVar148);
            auVar132 = vshufps_avx(auVar155,auVar155,0xb1);
            auVar132 = vminps_avx(auVar155,auVar132);
            auVar155 = vshufpd_avx(auVar132,auVar132,5);
            auVar132 = vminps_avx(auVar132,auVar155);
            auVar65 = vminps_avx(auVar132._0_16_,auVar132._16_16_);
            auVar132 = vshufps_avx(auVar16,auVar16,0xb1);
            auVar132 = vminps_avx(auVar16,auVar132);
            auVar139 = ZEXT864(0) << 0x20;
            auVar155 = vshufpd_avx(auVar132,auVar132,5);
            auVar132 = vminps_avx(auVar132,auVar155);
            auVar54 = vminps_avx(auVar132._0_16_,auVar132._16_16_);
            auVar54 = vunpcklps_avx(auVar65,auVar54);
            auVar132 = vshufps_avx(auVar17,auVar17,0xb1);
            auVar132 = vminps_avx(auVar17,auVar132);
            auVar155 = vshufpd_avx(auVar132,auVar132,5);
            auVar132 = vminps_avx(auVar132,auVar155);
            auVar65 = vminps_avx(auVar132._0_16_,auVar132._16_16_);
            auVar113._8_4_ = 0x5dccb9a2;
            auVar113._0_8_ = 0x5dccb9a25dccb9a2;
            auVar113._12_4_ = 0x5dccb9a2;
            auVar117 = ZEXT1664(auVar113);
            auVar65 = vinsertps_avx(auVar54,auVar65,0x28);
            auVar54 = vminps_avx(auVar52,auVar65);
            auVar132 = vshufps_avx(auVar11,auVar11,0xb1);
            auVar11 = vmaxps_avx(auVar11,auVar132);
            auVar132 = vshufpd_avx(auVar11,auVar11,5);
            auVar11 = vmaxps_avx(auVar11,auVar132);
            auVar52 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
            auVar11 = vshufps_avx(auVar154,auVar154,0xb1);
            auVar11 = vmaxps_avx(auVar154,auVar11);
            auVar154 = vshufpd_avx(auVar11,auVar11,5);
            auVar11 = vmaxps_avx(auVar11,auVar154);
            auVar65 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
            auVar65 = vunpcklps_avx(auVar52,auVar65);
            auVar11 = vshufps_avx(auVar148,auVar148,0xb1);
            auVar11 = vmaxps_avx(auVar148,auVar11);
            auVar154 = vshufpd_avx(auVar11,auVar11,5);
            auVar11 = vmaxps_avx(auVar11,auVar154);
            auVar52 = vmaxps_avx(auVar11._0_16_,auVar11._16_16_);
            auVar52 = vinsertps_avx(auVar65,auVar52,0x28);
            auVar102 = vmaxps_avx(auVar102,auVar52);
            auVar52 = vcmpps_avx(auVar54,auVar122,6);
            auVar102 = vcmpps_avx(auVar102,auVar113,1);
            auVar52 = vandps_avx(auVar102,auVar52);
            uVar44 = vmovmskps_avx(auVar52);
            if ((~(byte)uVar44 & 7) != 0) break;
            uVar42 = uVar42 + 1;
            lVar49 = lVar49 + 0x38;
            bVar10 = (ulong)(long)(int)uVar43 < uVar42;
          } while (uVar42 <= (ulong)(long)(int)uVar43);
        }
        if (bVar10) {
          local_210.primID = &local_200;
          fVar134 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                    super_CurveGeometry.super_Geometry.time_range.lower;
          local_1f8 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                      super_CurveGeometry.super_Geometry.time_range.upper - fVar134;
          fVar88 = (t0t1->lower - fVar134) / local_1f8;
          local_1f8 = (t0t1->upper - fVar134) / local_1f8;
          local_1b8 = fVar88;
          fVar88 = fVar2 * fVar88;
          fVar134 = fVar2 * local_1f8;
          auVar102 = vroundss_avx(ZEXT416((uint)fVar88),ZEXT416((uint)fVar88),9);
          auVar65 = vroundss_avx(ZEXT416((uint)fVar134),ZEXT416((uint)fVar134),10);
          auVar53 = vmaxss_avx(auVar102,auVar139._0_16_);
          local_1d8._0_4_ = auVar53._0_4_;
          auVar52 = vminss_avx(auVar65,ZEXT416((uint)fVar2));
          iVar46 = (int)auVar53._0_4_;
          fVar74 = auVar52._0_4_;
          uVar38 = (int)auVar102._0_4_;
          if ((int)auVar102._0_4_ < 0) {
            uVar38 = 0xffffffff;
          }
          iVar48 = (int)fVar2 + 1;
          if ((int)auVar65._0_4_ < (int)fVar2 + 1) {
            iVar48 = (int)auVar65._0_4_;
          }
          local_210.this = this;
          local_200 = uVar50;
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_138.field_1,&local_210,(long)iVar46);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_158.field_1,&local_210,(long)(int)fVar74);
          fVar88 = fVar88 - (float)local_1d8._0_4_;
          if (iVar48 - uVar38 == 1) {
            auVar53 = vmaxss_avx(ZEXT416((uint)fVar88),ZEXT816(0) << 0x40);
            auVar52 = vshufps_avx(auVar53,auVar53,0);
            auVar53 = ZEXT416((uint)(1.0 - auVar53._0_4_));
            auVar53 = vshufps_avx(auVar53,auVar53,0);
            auVar146._0_4_ = auVar52._0_4_ * local_158.m128[0] + auVar53._0_4_ * local_138.m128[0];
            auVar146._4_4_ = auVar52._4_4_ * local_158.m128[1] + auVar53._4_4_ * local_138.m128[1];
            auVar146._8_4_ = auVar52._8_4_ * local_158.m128[2] + auVar53._8_4_ * local_138.m128[2];
            auVar146._12_4_ =
                 auVar52._12_4_ * local_158.m128[3] + auVar53._12_4_ * local_138.m128[3];
            auVar129._0_4_ = auVar52._0_4_ * local_148 + auVar53._0_4_ * local_128;
            auVar129._4_4_ = auVar52._4_4_ * fStack_144 + auVar53._4_4_ * fStack_124;
            auVar129._8_4_ = auVar52._8_4_ * fStack_140 + auVar53._8_4_ * fStack_120;
            auVar129._12_4_ = auVar52._12_4_ * fStack_13c + auVar53._12_4_ * fStack_11c;
            auVar53 = vmaxss_avx(ZEXT416((uint)(fVar74 - fVar134)),ZEXT816(0) << 0x40);
            auVar52 = vshufps_avx(auVar53,auVar53,0);
            auVar53 = ZEXT416((uint)(1.0 - auVar53._0_4_));
            auVar53 = vshufps_avx(auVar53,auVar53,0);
            auVar78._0_4_ = auVar53._0_4_ * local_158.m128[0] + auVar52._0_4_ * local_138.m128[0];
            auVar78._4_4_ = auVar53._4_4_ * local_158.m128[1] + auVar52._4_4_ * local_138.m128[1];
            auVar78._8_4_ = auVar53._8_4_ * local_158.m128[2] + auVar52._8_4_ * local_138.m128[2];
            auVar78._12_4_ = auVar53._12_4_ * local_158.m128[3] + auVar52._12_4_ * local_138.m128[3]
            ;
            auVar110._0_4_ = auVar53._0_4_ * local_148 + auVar52._0_4_ * local_128;
            auVar110._4_4_ = auVar53._4_4_ * fStack_144 + auVar52._4_4_ * fStack_124;
            auVar110._8_4_ = auVar53._8_4_ * fStack_140 + auVar52._8_4_ * fStack_120;
            auVar110._12_4_ = auVar53._12_4_ * fStack_13c + auVar52._12_4_ * fStack_11c;
            auVar53 = ZEXT816(0);
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_210,(long)(iVar46 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_210,(long)((int)fVar74 + -1));
            auVar53 = vmaxss_avx(ZEXT416((uint)fVar88),ZEXT816(0) << 0x40);
            auVar52 = vshufps_avx(auVar53,auVar53,0);
            auVar53 = ZEXT416((uint)(1.0 - auVar53._0_4_));
            auVar53 = vshufps_avx(auVar53,auVar53,0);
            auVar146._0_4_ = auVar52._0_4_ * local_58.m128[0] + auVar53._0_4_ * local_138.m128[0];
            auVar146._4_4_ = auVar52._4_4_ * local_58.m128[1] + auVar53._4_4_ * local_138.m128[1];
            auVar146._8_4_ = auVar52._8_4_ * local_58.m128[2] + auVar53._8_4_ * local_138.m128[2];
            auVar146._12_4_ = auVar52._12_4_ * local_58.m128[3] + auVar53._12_4_ * local_138.m128[3]
            ;
            auVar129._0_4_ = auVar52._0_4_ * local_48 + auVar53._0_4_ * local_128;
            auVar129._4_4_ = auVar52._4_4_ * fStack_44 + auVar53._4_4_ * fStack_124;
            auVar129._8_4_ = auVar52._8_4_ * fStack_40 + auVar53._8_4_ * fStack_120;
            auVar129._12_4_ = auVar52._12_4_ * fStack_3c + auVar53._12_4_ * fStack_11c;
            auVar53 = vmaxss_avx(ZEXT416((uint)(fVar74 - fVar134)),ZEXT816(0) << 0x40);
            auVar52 = vshufps_avx(auVar53,auVar53,0);
            auVar53 = ZEXT416((uint)(1.0 - auVar53._0_4_));
            auVar53 = vshufps_avx(auVar53,auVar53,0);
            auVar78._0_4_ = auVar52._0_4_ * local_78.m128[0] + auVar53._0_4_ * local_158.m128[0];
            auVar78._4_4_ = auVar52._4_4_ * local_78.m128[1] + auVar53._4_4_ * local_158.m128[1];
            auVar78._8_4_ = auVar52._8_4_ * local_78.m128[2] + auVar53._8_4_ * local_158.m128[2];
            auVar78._12_4_ = auVar52._12_4_ * local_78.m128[3] + auVar53._12_4_ * local_158.m128[3];
            auVar110._0_4_ = auVar52._0_4_ * local_68 + auVar53._0_4_ * local_148;
            auVar110._4_4_ = auVar52._4_4_ * fStack_64 + auVar53._4_4_ * fStack_144;
            auVar110._8_4_ = auVar52._8_4_ * fStack_60 + auVar53._8_4_ * fStack_140;
            auVar110._12_4_ = auVar52._12_4_ * fStack_5c + auVar53._12_4_ * fStack_13c;
            if ((int)(uVar38 + 1) < iVar48) {
              local_198 = local_1f8 - local_1b8;
              itime = (size_t)(uVar38 + 1);
              iVar48 = ~uVar38 + iVar48;
              do {
                auVar59._0_4_ = ((float)(int)itime / fVar2 - local_1b8) / local_198;
                auVar59._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar53 = vshufps_avx(auVar59,auVar59,0);
                local_368._0_4_ = auVar78._0_4_;
                local_368._4_4_ = auVar78._4_4_;
                fStack_360 = auVar78._8_4_;
                fStack_35c = auVar78._12_4_;
                auVar52 = vshufps_avx(ZEXT416((uint)(1.0 - auVar59._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar59._0_4_)),0);
                fVar75 = auVar146._4_4_;
                fVar76 = auVar146._8_4_;
                fVar144 = auVar146._12_4_;
                local_1f8 = auVar53._0_4_ * (float)local_368._0_4_ + auVar146._0_4_ * auVar52._0_4_;
                fStack_1f4 = auVar53._4_4_ * (float)local_368._4_4_ + fVar75 * auVar52._4_4_;
                fStack_1f0 = auVar53._8_4_ * fStack_360 + fVar76 * auVar52._8_4_;
                fStack_1ec = auVar53._12_4_ * fStack_35c + fVar144 * auVar52._12_4_;
                fVar134 = auVar129._4_4_;
                fVar88 = auVar129._8_4_;
                fVar74 = auVar129._12_4_;
                local_178 = auVar110._0_4_ * auVar53._0_4_ + auVar129._0_4_ * auVar52._0_4_;
                fStack_174 = auVar110._4_4_ * auVar53._4_4_ + fVar134 * auVar52._4_4_;
                fStack_170 = auVar110._8_4_ * auVar53._8_4_ + fVar88 * auVar52._8_4_;
                fStack_16c = auVar110._12_4_ * auVar53._12_4_ + fVar74 * auVar52._12_4_;
                _local_1d8 = auVar110;
                linearBounds::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_210,itime);
                auVar19._4_4_ = fStack_1f4;
                auVar19._0_4_ = local_1f8;
                auVar19._8_4_ = fStack_1f0;
                auVar19._12_4_ = fStack_1ec;
                auVar53 = vsubps_avx((undefined1  [16])local_98,auVar19);
                auVar20._4_4_ = fStack_174;
                auVar20._0_4_ = local_178;
                auVar20._8_4_ = fStack_170;
                auVar20._12_4_ = fStack_16c;
                auVar102 = vsubps_avx(local_88,auVar20);
                auVar52 = vminps_avx(auVar53,ZEXT816(0) << 0x40);
                auVar53 = vmaxps_avx(auVar102,ZEXT816(0) << 0x40);
                auVar146._0_4_ = auVar146._0_4_ + auVar52._0_4_;
                auVar146._4_4_ = fVar75 + auVar52._4_4_;
                auVar146._8_4_ = fVar76 + auVar52._8_4_;
                auVar146._12_4_ = fVar144 + auVar52._12_4_;
                auVar78._0_4_ = (float)local_368._0_4_ + auVar52._0_4_;
                auVar78._4_4_ = (float)local_368._4_4_ + auVar52._4_4_;
                auVar78._8_4_ = fStack_360 + auVar52._8_4_;
                auVar78._12_4_ = fStack_35c + auVar52._12_4_;
                auVar129._0_4_ = auVar129._0_4_ + auVar53._0_4_;
                auVar129._4_4_ = fVar134 + auVar53._4_4_;
                auVar129._8_4_ = fVar88 + auVar53._8_4_;
                auVar129._12_4_ = fVar74 + auVar53._12_4_;
                auVar110._0_4_ = (float)local_1d8._0_4_ + auVar53._0_4_;
                auVar110._4_4_ = (float)local_1d8._4_4_ + auVar53._4_4_;
                auVar110._8_4_ = fStack_1d0 + auVar53._8_4_;
                auVar110._12_4_ = fStack_1cc + auVar53._12_4_;
                itime = itime + 1;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            auVar53 = ZEXT816(0) << 0x40;
          }
          auVar139 = ZEXT1664(auVar53);
          aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar146,ZEXT416(geomID),0x30);
          uVar38 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.super_Geometry.numTimeSteps - 1;
          uVar39 = (ulong)uVar38;
          aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar129,ZEXT416((uint)uVar50),0x30);
          aVar14 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar78,ZEXT416(uVar38),0x30);
          aVar15 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar110,ZEXT416(uVar38),0x30);
          auVar101._0_4_ = aVar12.x * 0.5 + aVar14.x * 0.5 + aVar13.x * 0.5 + aVar15.x * 0.5;
          auVar101._4_4_ = aVar12.y * 0.5 + aVar14.y * 0.5 + aVar13.y * 0.5 + aVar15.y * 0.5;
          auVar101._8_4_ = aVar12.z * 0.5 + aVar14.z * 0.5 + aVar13.z * 0.5 + aVar15.z * 0.5;
          auVar101._12_4_ =
               aVar12.field_3.w * 0.5 + aVar14.field_3.w * 0.5 +
               aVar13.field_3.w * 0.5 + aVar15.field_3.w * 0.5;
          _local_258 = vminps_avx(_local_258,(undefined1  [16])aVar12);
          _local_268 = vmaxps_avx(_local_268,(undefined1  [16])aVar13);
          _local_2b8 = vminps_avx(_local_2b8,(undefined1  [16])aVar14);
          _local_2a8 = vmaxps_avx(_local_2a8,(undefined1  [16])aVar15);
          _local_298 = vminps_avx(_local_298,auVar101);
          _local_288 = vmaxps_avx(_local_288,auVar101);
          auVar53 = vshufpd_avx(local_278,local_278,1);
          BVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry
                  .super_Geometry.time_range;
          auVar114._8_4_ = BVar4.lower;
          auVar114._12_4_ = BVar4.upper;
          auVar114._0_4_ = BVar4.lower;
          auVar114._4_4_ = BVar4.upper;
          auVar53 = vcmpps_avx(auVar53,auVar114,1);
          local_300 = local_300 + 1;
          local_2f8 = local_2f8 + uVar39;
          auVar53 = vshufps_avx(ZEXT416((uint)CONCAT71((int7)((ulong)pBVar40 >> 8),
                                                       local_330 < uVar39)),auVar53,0x40);
          auVar102 = vpslld_avx(auVar53,0x1f);
          auVar123._8_8_ = local_278._8_8_;
          auVar123._0_4_ = BVar4.lower;
          auVar123._4_4_ = BVar4.upper;
          auVar52 = vshufps_avx(auVar123,auVar123,100);
          auVar53 = vblendps_avx(local_278,auVar114,4);
          local_278 = vblendvps_avx(auVar53,auVar52,auVar102);
          if (local_330 <= uVar39) {
            local_330 = uVar39;
          }
          pPVar9 = prims->items;
          pPVar9[local_2e0].lbounds.bounds0.lower.field_0.field_1 = aVar12;
          pPVar9[local_2e0].lbounds.bounds0.upper.field_0.field_1 = aVar13;
          pPVar9[local_2e0].lbounds.bounds1.lower.field_0.field_1 = aVar14;
          pPVar9[local_2e0].lbounds.bounds1.upper.field_0.field_1 = aVar15;
          BVar4 = (BBox1f)vmovlpd_avx(auVar114);
          pPVar9[local_2e0].time_range = BVar4;
          auVar117 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          auVar124 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          local_2e0 = local_2e0 + 1;
        }
      }
      uVar50 = uVar50 + 1;
    } while (uVar50 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_300;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[0] = (float)local_258._0_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[1] = (float)local_258._4_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[2] = fStack_250;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[3] = fStack_24c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[0] = (float)local_268._0_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[1] = (float)local_268._4_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[2] = fStack_260;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[3] = fStack_25c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[0] = (float)local_2b8._0_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[1] = (float)local_2b8._4_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[2] = fStack_2b0;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[3] = fStack_2ac;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[0] = (float)local_2a8._0_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[1] = (float)local_2a8._4_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[2] = fStack_2a0;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[3] = fStack_29c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = (float)local_298._0_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = (float)local_298._4_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = fStack_290;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = fStack_28c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = (float)local_288._0_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = (float)local_288._4_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = fStack_280;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = fStack_27c;
  __return_storage_ptr__->num_time_segments = local_2f8;
  __return_storage_ptr__->max_num_time_segments = local_330;
  __return_storage_ptr__->max_time_range = (BBox1f)local_278._0_8_;
  __return_storage_ptr__->time_range = (BBox1f)local_278._8_8_;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }